

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O2

void P_CalcHeight(player_t *player)

{
  APlayerPawn *pAVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  if ((player->cheats & 0x40000000) == 0) {
    if ((((player->mo->super_AActor).flags.Value & 0x200) != 0) && (player->onground == false)) {
      player->bob = 0.5;
      dVar4 = 0.5;
      goto LAB_00464387;
    }
    dVar4 = (player->Vel).X;
    dVar6 = (player->Vel).Y;
    dVar4 = dVar6 * dVar6 + dVar4 * dVar4;
    player->bob = dVar4;
    bVar2 = true;
    if ((dVar4 != 0.0) || (NAN(dVar4))) {
      dVar4 = userinfo_t::GetMoveBob(&player->userinfo);
      dVar4 = dVar4 * player->bob;
      player->bob = dVar4;
      if (16.0 < dVar4) {
        player->bob = 16.0;
        dVar4 = 16.0;
      }
      goto LAB_00464387;
    }
  }
  else {
    player->bob = 0.0;
    dVar4 = 0.0;
LAB_00464387:
    bVar2 = false;
  }
  pAVar1 = player->mo;
  dVar6 = pAVar1->ViewHeight + player->crouchviewdelta;
  if ((player->cheats & 4) != 0) {
    dVar6 = dVar6 + (pAVar1->super_AActor).__Pos.Z;
    player->viewz = dVar6;
    dVar4 = (pAVar1->super_AActor).ceilingz + -4.0;
    if (dVar6 <= dVar4) {
      return;
    }
    goto LAB_004645d9;
  }
  if (bVar2) {
    if (player->health < 1) {
      dVar4 = 0.0;
    }
    else {
      dVar4 = (double)level.time;
      dVar3 = userinfo_t::GetStillBob(&player->userinfo);
      dVar4 = fastsindeg((dVar4 / 120.0) * 360.0);
      dVar4 = dVar4 * dVar3;
    }
  }
  else {
    dVar3 = fastsindeg(((double)level.time / 20.0) * 360.0);
    dVar4 = dVar4 * dVar3 *
            *(double *)(&DAT_005d9e20 + (ulong)(1 < (player->mo->super_AActor).waterlevel) * 8);
  }
  if (player->playerstate == '\0') {
    dVar3 = player->deltaviewheight;
    dVar5 = player->viewheight + dVar3;
    player->viewheight = dVar5;
    if (dVar5 <= dVar6) {
      dVar6 = dVar6 * 0.5;
      if ((dVar6 <= dVar5) || (player->viewheight = dVar6, dVar5 = dVar6, 0.0 < dVar3)) {
        dVar6 = dVar5;
        if ((dVar3 == 0.0) && (!NAN(dVar3))) goto LAB_0046454b;
      }
      else {
        dVar3 = 1.52587890625e-05;
      }
      dVar3 = dVar3 + 0.25;
      player->deltaviewheight = dVar3;
      dVar5 = dVar6;
      if ((dVar3 == 0.0) && (!NAN(dVar3))) {
        player->deltaviewheight = 1.52587890625e-05;
      }
    }
    else {
      player->viewheight = dVar6;
      player->deltaviewheight = 0.0;
      dVar5 = dVar6;
    }
  }
  else {
    dVar5 = player->viewheight;
  }
LAB_0046454b:
  if (player->morphTics != 0) {
    dVar4 = 0.0;
  }
  pAVar1 = player->mo;
  dVar6 = (pAVar1->super_AActor).__Pos.Z;
  dVar3 = dVar4 * pAVar1->ViewBob + dVar5 + dVar6;
  player->viewz = dVar3;
  if (player->playerstate != '\x01') {
    dVar4 = (pAVar1->super_AActor).Floorclip;
    if (((dVar4 != 0.0) || (NAN(dVar4))) && (dVar6 <= (pAVar1->super_AActor).floorz)) {
      dVar3 = dVar3 - dVar4;
      player->viewz = dVar3;
    }
  }
  dVar4 = (pAVar1->super_AActor).ceilingz + -4.0;
  if (dVar4 < dVar3) {
    player->viewz = dVar4;
    dVar3 = dVar4;
  }
  dVar4 = (pAVar1->super_AActor).floorz + 4.0;
  if (dVar4 <= dVar3) {
    return;
  }
LAB_004645d9:
  player->viewz = dVar4;
  return;
}

Assistant:

void P_CalcHeight (player_t *player) 
{
	DAngle		angle;
	double	 	bob;
	bool		still = false;

	// Regular movement bobbing
	// (needs to be calculated for gun swing even if not on ground)

	// killough 10/98: Make bobbing depend only on player-applied motion.
	//
	// Note: don't reduce bobbing here if on ice: if you reduce bobbing here,
	// it causes bobbing jerkiness when the player moves from ice to non-ice,
	// and vice-versa.

	if (player->cheats & CF_NOCLIP2)
	{
		player->bob = 0;
	}
	else if ((player->mo->flags & MF_NOGRAVITY) && !player->onground)
	{
		player->bob = 0.5;
	}
	else
	{
		player->bob = player->Vel.LengthSquared();
		if (player->bob == 0)
		{
			still = true;
		}
		else
		{
			player->bob *= player->userinfo.GetMoveBob();

			if (player->bob > MAXBOB)
				player->bob = MAXBOB;
		}
	}

	double defaultviewheight = player->mo->ViewHeight + player->crouchviewdelta;

	if (player->cheats & CF_NOVELOCITY)
	{
		player->viewz = player->mo->Z() + defaultviewheight;

		if (player->viewz > player->mo->ceilingz-4)
			player->viewz = player->mo->ceilingz-4;

		return;
	}

	if (still)
	{
		if (player->health > 0)
		{
			angle = level.time / (120 * TICRATE / 35.) * 360.;
			bob = player->userinfo.GetStillBob() * angle.Sin();
		}
		else
		{
			bob = 0;
		}
	}
	else
	{
		angle = level.time / (20 * TICRATE / 35.) * 360.;
		bob = player->bob * angle.Sin() * (player->mo->waterlevel > 1 ? 0.25f : 0.5f);
	}

	// move viewheight
	if (player->playerstate == PST_LIVE)
	{
		player->viewheight += player->deltaviewheight;

		if (player->viewheight > defaultviewheight)
		{
			player->viewheight = defaultviewheight;
			player->deltaviewheight = 0;
		}
		else if (player->viewheight < (defaultviewheight/2))
		{
			player->viewheight = defaultviewheight/2;
			if (player->deltaviewheight <= 0)
				player->deltaviewheight = 1 / 65536.;
		}
		
		if (player->deltaviewheight)	
		{
			player->deltaviewheight += 0.25;
			if (!player->deltaviewheight)
				player->deltaviewheight = 1/65536.;
		}
	}

	if (player->morphTics)
	{
		bob = 0;
	}
	player->viewz = player->mo->Z() + player->viewheight + (bob * player->mo->ViewBob); // [SP] Allow DECORATE changes to view bobbing speed.
	if (player->mo->Floorclip && player->playerstate != PST_DEAD
		&& player->mo->Z() <= player->mo->floorz)
	{
		player->viewz -= player->mo->Floorclip;
	}
	if (player->viewz > player->mo->ceilingz - 4)
	{
		player->viewz = player->mo->ceilingz - 4;
	}
	if (player->viewz < player->mo->floorz + 4)
	{
		player->viewz = player->mo->floorz + 4;
	}
}